

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O3

size_t __thiscall argo::lexer::read_digits(lexer *this,size_t *index)

{
  uint c;
  size_t sVar1;
  
  c = (*this->m_reader->_vptr_reader[2])();
  sVar1 = 0;
  while (c - 0x30 < 10) {
    append_to_number_buffer(this,this->m_buffer,index,c);
    sVar1 = sVar1 + 1;
    c = (*this->m_reader->_vptr_reader[2])();
  }
  (*this->m_reader->_vptr_reader[3])(this->m_reader,(ulong)c);
  return sVar1;
}

Assistant:

size_t lexer::read_digits(size_t &index)
{
    size_t num_digits = 0;

    while (true)
    {
        int c = m_reader.next();
        if (isdigit(c))
        {
            append_to_number_buffer(m_buffer, index, c);
            num_digits++;
        }
        else
        {
            m_reader.put_back(c);
            return num_digits;
        }
    }
}